

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  if (argc < 3) {
    std::operator<<((ostream *)&std::cout,"Please Input the dataset path:");
    std::operator>>((istream *)&std::cin,(string *)&FILE_NAME_abi_cxx11_);
    std::operator<<((ostream *)&std::cout,"Please Input the length of record in dtaset:");
    std::istream::operator>>((istream *)&std::cin,&record_length);
  }
  else {
    std::__cxx11::string::assign((char *)&FILE_NAME_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_70,argv[2],&local_71);
    record_length = std::__cxx11::stoi(&local_70,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_70);
  }
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m|         Application: Find Super Spreader         |\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m|                     F1 SCORE                     |\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  std::__cxx11::string::string((string *)&local_30,(string *)&FILE_NAME_abi_cxx11_);
  SuperSpread_Test_Hitter<4u>(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m|                    THROUGHPUT                    |\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  std::__cxx11::string::string((string *)&local_50,(string *)&FILE_NAME_abi_cxx11_);
  SuperSpread_Test_Speed<4u>(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  // ===================== Determine the threshold==================
  // cout << FILE_NAME << endl;

  // HashMap mp;
  // StreamMap sp;

  // FILE* file = fopen((FILE_NAME).c_str(),"rb");
  // Data from;
  // Data to;
  // uint num = 0;
  // while(num<interval)
  // {
  //     fread(from.str, DATA_LEN, 1, file);
  //     fread(&to.str, DATA_LEN, 1, file);

  //     Stream stream(from, to);
  //     if(sp.find(stream) == sp.end()){
  //         sp[stream] = 1;
  //         if(mp.find(from) == mp.end())
  //             mp[from] = 1;
  //         else
  //             mp[from] += 1;
  //     }
  //     num++;
  // }
  // printf("HIT=%d\n", Get_TopK(mp, 250));
  // ===============================================================
    if (argc > 2)
    {
        FILE_NAME = argv[1];
        record_length = std::stoi(argv[2]);
    }
    else
    {
        std::cout << "Please Input the dataset path:";
        std::cin >> FILE_NAME;
        std::cout << "Please Input the length of record in dtaset:";
        std::cin >> record_length;
    }
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|         Application: Find Super Spreader         "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|                     F1 SCORE                     "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  SuperSpread_Test_Hitter<4>(FILE_NAME);
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|                    THROUGHPUT                    "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  SuperSpread_Test_Speed<4>(FILE_NAME);
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
}